

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::MethodDescriptorProto::SharedDtor(MessageLite *self)

{
  MethodOptions *this;
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[1]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 2));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[2]._internal_metadata_);
    this = (MethodOptions *)self[3]._vptr_MessageLite;
    if (this != (MethodOptions *)0x0) {
      MethodOptions::~MethodOptions(this);
      operator_delete(this,0x58);
      return;
    }
    return;
  }
  SharedDtor((MethodDescriptorProto *)&stack0xffffffffffffffe0);
}

Assistant:

inline void MethodDescriptorProto::SharedDtor(MessageLite& self) {
  MethodDescriptorProto& this_ = static_cast<MethodDescriptorProto&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  this_._impl_.input_type_.Destroy();
  this_._impl_.output_type_.Destroy();
  delete this_._impl_.options_;
  this_._impl_.~Impl_();
}